

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<3>::InnerLeaf<2>
          (InnerLeaf<3> *this,InnerLeaf<2> *other)

{
  int iVar1;
  
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_38UL>::array(&this->entries);
  (this->occupation).occupation = (other->occupation).occupation;
  iVar1 = other->size;
  this->size = iVar1;
  if (iVar1 + 1 != 0) {
    memmove(&this->hashes,&other->hashes,(long)(iVar1 + 1) << 3);
  }
  std::__copy_move<true,false,std::random_access_iterator_tag>::
  __copy_m<HighsHashTableEntry<std::pair<int,int>,double>*,HighsHashTableEntry<std::pair<int,int>,double>*>
            ((other->entries)._M_elems,(other->entries)._M_elems + iVar1,(this->entries)._M_elems);
  return;
}

Assistant:

InnerLeaf(InnerLeaf<kOtherSize>&& other) {
      assert(other.size <= capacity());
      occupation = other.occupation;
      size = other.size;
      std::copy(other.hashes.cbegin(),
                std::next(other.hashes.cbegin(), size + 1), hashes.begin());
      std::move(other.entries.begin(), std::next(other.entries.begin(), size),
                entries.begin());
    }